

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O2

void cb_editor_command_input(Fl_Input *param_1,void *param_2)

{
  strncpy(G_external_editor_command,(editor_command_input->super_Fl_Input_).value_,0x1ff);
  G_external_editor_command[0x1ff] = '\0';
  Fl_Preferences::set(&fluid_prefs,"external_editor_command",G_external_editor_command);
  redraw_browser();
  return;
}

Assistant:

static void cb_editor_command_input(Fl_Input*, void*) {
  strncpy(G_external_editor_command, editor_command_input->value(), sizeof(G_external_editor_command)-1);
G_external_editor_command[sizeof(G_external_editor_command)-1] = 0;
fluid_prefs.set("external_editor_command", G_external_editor_command);
redraw_browser();
}